

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001be080 = 0x2e2e2e2e2e2e2e;
    uRam00000000001be087._0_1_ = '.';
    uRam00000000001be087._1_1_ = '.';
    uRam00000000001be087._2_1_ = '.';
    uRam00000000001be087._3_1_ = '.';
    uRam00000000001be087._4_1_ = '.';
    uRam00000000001be087._5_1_ = '.';
    uRam00000000001be087._6_1_ = '.';
    uRam00000000001be087._7_1_ = '.';
    DAT_001be070 = '.';
    DAT_001be070_1._0_1_ = '.';
    DAT_001be070_1._1_1_ = '.';
    DAT_001be070_1._2_1_ = '.';
    DAT_001be070_1._3_1_ = '.';
    DAT_001be070_1._4_1_ = '.';
    DAT_001be070_1._5_1_ = '.';
    DAT_001be070_1._6_1_ = '.';
    uRam00000000001be078 = 0x2e2e2e2e2e2e2e;
    DAT_001be07f = 0x2e;
    DAT_001be060 = '.';
    DAT_001be060_1._0_1_ = '.';
    DAT_001be060_1._1_1_ = '.';
    DAT_001be060_1._2_1_ = '.';
    DAT_001be060_1._3_1_ = '.';
    DAT_001be060_1._4_1_ = '.';
    DAT_001be060_1._5_1_ = '.';
    DAT_001be060_1._6_1_ = '.';
    uRam00000000001be068._0_1_ = '.';
    uRam00000000001be068._1_1_ = '.';
    uRam00000000001be068._2_1_ = '.';
    uRam00000000001be068._3_1_ = '.';
    uRam00000000001be068._4_1_ = '.';
    uRam00000000001be068._5_1_ = '.';
    uRam00000000001be068._6_1_ = '.';
    uRam00000000001be068._7_1_ = '.';
    DAT_001be050 = '.';
    DAT_001be050_1._0_1_ = '.';
    DAT_001be050_1._1_1_ = '.';
    DAT_001be050_1._2_1_ = '.';
    DAT_001be050_1._3_1_ = '.';
    DAT_001be050_1._4_1_ = '.';
    DAT_001be050_1._5_1_ = '.';
    DAT_001be050_1._6_1_ = '.';
    uRam00000000001be058._0_1_ = '.';
    uRam00000000001be058._1_1_ = '.';
    uRam00000000001be058._2_1_ = '.';
    uRam00000000001be058._3_1_ = '.';
    uRam00000000001be058._4_1_ = '.';
    uRam00000000001be058._5_1_ = '.';
    uRam00000000001be058._6_1_ = '.';
    uRam00000000001be058._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001be048._0_1_ = '.';
    uRam00000000001be048._1_1_ = '.';
    uRam00000000001be048._2_1_ = '.';
    uRam00000000001be048._3_1_ = '.';
    uRam00000000001be048._4_1_ = '.';
    uRam00000000001be048._5_1_ = '.';
    uRam00000000001be048._6_1_ = '.';
    uRam00000000001be048._7_1_ = '.';
    DAT_001be08f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}